

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::ruby::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  if (*(int *)(file + 0x8c) == 3) {
    GetOutputFilename((string *)&printer,*(string **)file);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::~string((string *)&printer);
    io::Printer::Printer(&printer,output,'$');
    bVar1 = GenerateFile(file,&printer,error);
    io::Printer::~Printer(&printer);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  else {
    std::__cxx11::string::assign((char *)error);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate Ruby code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(GetOutputFilename(file->name())));
  io::Printer printer(output.get(), '$');

  return GenerateFile(file, &printer, error);
}